

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitInstructionImpl
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst,size_t inst_byte_offset,
          uint32_t block_indent,bool is_in_block)

{
  spv_operand_type_t sVar1;
  initializer_list<unsigned_int> __l;
  byte bVar2;
  Op opcode_00;
  uint32_t uVar3;
  uint uVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined8 uVar8;
  size_type sVar9;
  int iVar10;
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0 [36];
  uint local_47c;
  uint32_t local_478;
  undefined4 local_474;
  iterator local_470;
  undefined8 local_468;
  uint local_45c;
  undefined1 local_458 [4];
  uint32_t align;
  uint32_t local_434;
  string local_430 [4];
  uint32_t line_length;
  string local_410 [32];
  string local_3f0 [36];
  uint32_t local_3cc;
  spv_parsed_operand_t *psStack_3c8;
  uint32_t word;
  spv_parsed_operand_t *operand;
  undefined1 local_3b5;
  fmtflags local_3b4;
  char_type saved_fill;
  char *pcStack_3b0;
  fmtflags saved_flags;
  char *comment_separator;
  ostringstream comments;
  ushort local_22c;
  allocator<char> local_229;
  spv_operand_type_t type;
  uint16_t i;
  undefined1 local_201;
  uint32_t local_200;
  bool body_indent;
  uint32_t indent;
  int local_1d4 [3];
  undefined1 local_1c8 [8];
  string id_name;
  ostringstream line;
  Op opcode;
  bool is_in_block_local;
  uint32_t block_indent_local;
  size_t inst_byte_offset_local;
  spv_parsed_instruction_t *inst_local;
  InstructionDisassembler *this_local;
  
  opcode_00 = (Op)inst->opcode;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(id_name.field_2._M_local_buf + 8));
  if (((this->nested_indent_ & 1U) != 0) && (opcode_00 == OpLabel)) {
    std::ostream::operator<<(this->stream_,std::endl<char,std::char_traits<char>>);
  }
  if (inst->result_id == 0) {
    iVar10 = this->indent_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&indent,(long)iVar10,' ',(allocator<char> *)&body_indent);
    std::operator<<((ostream *)(id_name.field_2._M_local_buf + 8),(string *)&indent);
    std::__cxx11::string::~string((string *)&indent);
    std::allocator<char>::~allocator((allocator<char> *)&body_indent);
  }
  else {
    SetBlue(this);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 &this->name_mapper_,inst->result_id);
    if (this->indent_ != 0) {
      local_1d4[1] = 0;
      iVar10 = this->indent_;
      local_1d4[0] = std::__cxx11::string::size();
      local_1d4[0] = (iVar10 + -3) - local_1d4[0];
      piVar5 = std::max<int>(local_1d4 + 1,local_1d4);
      local_1d4[2] = (int)std::setw(*piVar5);
      std::operator<<((ostream *)(id_name.field_2._M_local_buf + 8),(_Setw)local_1d4[2]);
    }
    poVar6 = std::operator<<((ostream *)(id_name.field_2._M_local_buf + 8),"%");
    std::operator<<(poVar6,(string *)local_1c8);
    ResetColor(this);
    std::operator<<((ostream *)(id_name.field_2._M_local_buf + 8)," = ");
    std::__cxx11::string::~string((string *)local_1c8);
  }
  if (((this->nested_indent_ & 1U) != 0) && (is_in_block)) {
    local_201 = opcode_00 != OpLabel;
    iVar10 = 0;
    if ((bool)local_201) {
      iVar10 = 2;
    }
    local_200 = block_indent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,(ulong)(block_indent * 2 + iVar10),' ',&local_229);
    std::operator<<((ostream *)(id_name.field_2._M_local_buf + 8),(string *)&type);
    std::__cxx11::string::~string((string *)&type);
    std::allocator<char>::~allocator(&local_229);
  }
  poVar6 = std::operator<<((ostream *)(id_name.field_2._M_local_buf + 8),"Op");
  pcVar7 = spvOpcodeString(opcode_00);
  std::operator<<(poVar6,pcVar7);
  local_22c = 0;
  while( true ) {
    if (inst->num_operands <= local_22c) {
      if (this->comment_ != 0) {
        GenerateCommentForDecoratedId(this,inst);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment_separator);
      pcStack_3b0 = "";
      if ((this->show_byte_offset_ & 1U) != 0) {
        SetGrey(this,(ostream *)&comment_separator);
        local_3b4 = std::ios_base::flags
                              ((ios_base *)
                               ((long)&comment_separator + *(long *)(comment_separator + -0x18)));
        local_3b5 = std::ios::fill();
        poVar6 = std::operator<<((ostream *)&comment_separator,pcStack_3b0);
        poVar6 = std::operator<<(poVar6,"0x");
        operand._4_4_ = std::setw(8);
        poVar6 = std::operator<<(poVar6,operand._4_4_);
        uVar8 = std::ostream::operator<<(poVar6,std::hex);
        operand._3_1_ = std::setfill<char>('0');
        poVar6 = std::operator<<(uVar8,operand._3_1_);
        std::ostream::operator<<(poVar6,inst_byte_offset);
        std::ios_base::flags
                  ((ios_base *)((long)&comment_separator + *(long *)(comment_separator + -0x18)),
                   local_3b4);
        std::ios::fill((char)&comment_separator + (char)*(undefined8 *)(comment_separator + -0x18));
        ResetColor(this,(ostream *)&comment_separator);
        pcStack_3b0 = ", ";
      }
      if ((this->comment_ != 0) && (opcode_00 == OpName)) {
        psStack_3c8 = inst->operands;
        local_3cc = inst->words[psStack_3c8->offset];
        poVar6 = std::operator<<((ostream *)&comment_separator,pcStack_3b0);
        poVar6 = std::operator<<(poVar6,"id %");
        std::ostream::operator<<(poVar6,local_3cc);
        pcStack_3b0 = ", ";
      }
      if (((this->comment_ != 0) && (inst->result_id != 0)) &&
         (sVar9 = std::
                  unordered_map<unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::count(&this->id_comments_,&inst->result_id), sVar9 != 0)) {
        poVar6 = std::operator<<((ostream *)&comment_separator,pcStack_3b0);
        std::
        unordered_map<unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->id_comments_,&inst->result_id);
        std::__cxx11::ostringstream::str();
        std::operator<<(poVar6,local_3f0);
        std::__cxx11::string::~string(local_3f0);
        pcStack_3b0 = ", ";
      }
      poVar6 = this->stream_;
      std::__cxx11::ostringstream::str();
      std::operator<<(poVar6,local_410);
      std::__cxx11::string::~string(local_410);
      std::__cxx11::ostringstream::str();
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_430);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        this->last_instruction_comment_alignment_ = 0;
      }
      else {
        std::__cxx11::ostringstream::str();
        uVar3 = anon_unknown_0::GetLineLengthWithoutColor((string *)local_458);
        std::__cxx11::string::~string((string *)local_458);
        local_47c = uVar3 + 2;
        local_478 = this->last_instruction_comment_alignment_;
        local_474 = 0x32;
        local_470 = &local_47c;
        local_468 = 3;
        __l._M_len = 3;
        __l._M_array = local_470;
        local_434 = uVar3;
        uVar4 = std::max<unsigned_int>(__l);
        local_45c = uVar4 + 3 & 0xfffffffc;
        this->last_instruction_comment_alignment_ = local_45c;
        poVar6 = this->stream_;
        uVar4 = local_45c - local_434;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_4a0,(ulong)uVar4,' ',&local_4a1);
        poVar6 = std::operator<<(poVar6,local_4a0);
        poVar6 = std::operator<<(poVar6,"; ");
        std::__cxx11::ostringstream::str();
        std::operator<<(poVar6,local_4c8);
        std::__cxx11::string::~string(local_4c8);
        std::__cxx11::string::~string(local_4a0);
        std::allocator<char>::~allocator(&local_4a1);
      }
      std::operator<<(this->stream_,"\n");
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment_separator);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)(id_name.field_2._M_local_buf + 8));
      return;
    }
    sVar1 = inst->operands[local_22c].type;
    if (sVar1 == SPV_OPERAND_TYPE_NONE) break;
    if (sVar1 != SPV_OPERAND_TYPE_RESULT_ID) {
      std::operator<<((ostream *)(id_name.field_2._M_local_buf + 8)," ");
      EmitOperand(this,(ostream *)(id_name.field_2._M_local_buf + 8),inst,local_22c);
    }
    local_22c = local_22c + 1;
  }
  __assert_fail("type != SPV_OPERAND_TYPE_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                ,0x2d4,
                "void spvtools::disassemble::InstructionDisassembler::EmitInstructionImpl(const spv_parsed_instruction_t &, size_t, uint32_t, bool)"
               );
}

Assistant:

void InstructionDisassembler::EmitInstructionImpl(
    const spv_parsed_instruction_t& inst, size_t inst_byte_offset,
    uint32_t block_indent, bool is_in_block) {
  auto opcode = static_cast<spv::Op>(inst.opcode);

  // To better align the comments (if any), write the instruction to a line
  // first so its length can be readily available.
  std::ostringstream line;

  if (nested_indent_ && opcode == spv::Op::OpLabel) {
    // Separate the blocks by an empty line to make them easier to separate
    stream_ << std::endl;
  }

  if (inst.result_id) {
    SetBlue();
    const std::string id_name = name_mapper_(inst.result_id);
    if (indent_)
      line << std::setw(std::max(0, indent_ - 3 - int(id_name.size())));
    line << "%" << id_name;
    ResetColor();
    line << " = ";
  } else {
    line << std::string(indent_, ' ');
  }

  if (nested_indent_ && is_in_block) {
    // Output OpLabel at the specified nest level, and instructions inside
    // blocks nested a little more.
    uint32_t indent = block_indent;
    bool body_indent = opcode != spv::Op::OpLabel;

    line << std::string(
        indent * kBlockNestIndent + (body_indent ? kBlockBodyIndentOffset : 0),
        ' ');
  }

  line << "Op" << spvOpcodeString(opcode);

  for (uint16_t i = 0; i < inst.num_operands; i++) {
    const spv_operand_type_t type = inst.operands[i].type;
    assert(type != SPV_OPERAND_TYPE_NONE);
    if (type == SPV_OPERAND_TYPE_RESULT_ID) continue;
    line << " ";
    EmitOperand(line, inst, i);
  }

  // For the sake of comment generation, store information from some
  // instructions for the future.
  if (comment_) {
    GenerateCommentForDecoratedId(inst);
  }

  std::ostringstream comments;
  const char* comment_separator = "";

  if (show_byte_offset_) {
    SetGrey(comments);
    auto saved_flags = comments.flags();
    auto saved_fill = comments.fill();
    comments << comment_separator << "0x" << std::setw(8) << std::hex
             << std::setfill('0') << inst_byte_offset;
    comments.flags(saved_flags);
    comments.fill(saved_fill);
    ResetColor(comments);
    comment_separator = ", ";
  }

  if (comment_ && opcode == spv::Op::OpName) {
    const spv_parsed_operand_t& operand = inst.operands[0];
    const uint32_t word = inst.words[operand.offset];
    comments << comment_separator << "id %" << word;
    comment_separator = ", ";
  }

  if (comment_ && inst.result_id && id_comments_.count(inst.result_id) > 0) {
    comments << comment_separator << id_comments_[inst.result_id].str();
    comment_separator = ", ";
  }

  stream_ << line.str();

  if (!comments.str().empty()) {
    // Align the comments
    const uint32_t line_length = GetLineLengthWithoutColor(line.str());
    uint32_t align = std::max(
        {line_length + 2, last_instruction_comment_alignment_, kCommentColumn});
    // Round up the alignment to a multiple of 4 for more niceness.
    align = (align + 3) & ~0x3u;
    last_instruction_comment_alignment_ = align;

    stream_ << std::string(align - line_length, ' ') << "; " << comments.str();
  } else {
    last_instruction_comment_alignment_ = 0;
  }

  stream_ << "\n";
}